

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

void opj_t1_dec_clnpass(opj_t1_t *t1,OPJ_INT32 bpno,OPJ_INT32 cblksty)

{
  OPJ_BYTE **ppOVar1;
  OPJ_UINT32 *pOVar2;
  byte *pbVar3;
  opj_mqc_state_t **ppoVar4;
  byte bVar5;
  byte bVar6;
  OPJ_BYTE *pOVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  ulong uVar12;
  opj_mqc_state_t *poVar13;
  int iVar14;
  opj_flag_t *flagsp;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  OPJ_UINT32 OVar18;
  uint *puVar19;
  uint uVar20;
  uint uVar21;
  opj_mqc_state_t **ppoVar22;
  uint uVar23;
  OPJ_UINT32 c;
  OPJ_UINT32 OVar24;
  uint uVar25;
  OPJ_UINT32 OVar26;
  OPJ_UINT32 OVar27;
  opj_mqc_t *mqc;
  uint *puVar28;
  OPJ_UINT32 OVar29;
  ulong uVar30;
  opj_mqc_state_t **ppoVar31;
  uint uVar32;
  uint uVar33;
  bool bVar34;
  uint local_60;
  
  uVar16 = t1->w;
  uVar30 = (ulong)uVar16;
  if ((uVar30 == 0x40) && (t1->h == 0x40)) {
    puVar9 = t1->flags + 0x43;
    uVar20 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    ppOVar1 = &(t1->mqc).bp;
    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
    uVar21 = -uVar20;
    ppoVar22 = (t1->mqc).ctxs + 0x11;
    ppoVar4 = (t1->mqc).ctxs + 0x12;
    puVar19 = (uint *)t1->data;
    ppoVar31 = (t1->mqc).curctx;
    OVar24 = (t1->mqc).c;
    uVar16 = (t1->mqc).a;
    OVar18 = (t1->mqc).ct;
    if ((cblksty & 8U) == 0) {
      uVar11 = 0;
      do {
        iVar14 = 0;
        do {
          puVar28 = puVar19;
          puVar10 = puVar9;
          uVar8 = *puVar10;
          uVar30 = (ulong)uVar8;
          if (uVar30 == 0) {
            poVar13 = *ppoVar22;
            uVar8 = poVar13->qeval;
            uVar17 = uVar16 - uVar8;
            if (OVar24 >> 0x10 < uVar8) {
              OVar26 = poVar13->mps;
              *ppoVar22 = (&poVar13->nmps)[uVar8 <= uVar17];
              uVar16 = uVar8;
              do {
                if (OVar18 == 0) {
                  pOVar7 = *ppOVar1;
                  bVar5 = pOVar7[1];
                  if (*pOVar7 == 0xff) {
                    if (bVar5 < 0x90) {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x200;
                      OVar18 = 7;
                      goto LAB_00136a87;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar7 + 1;
                    OVar24 = OVar24 + (uint)bVar5 * 0x100;
                  }
                  OVar18 = 8;
                }
LAB_00136a87:
                uVar16 = uVar16 * 2;
                OVar24 = OVar24 * 2;
                OVar18 = OVar18 - 1;
              } while (uVar16 < 0x8000);
              OVar29 = (uint)(OVar26 == 0);
              if (uVar17 < uVar8) {
                OVar29 = OVar26;
              }
            }
            else {
              OVar24 = OVar24 + uVar8 * -0x10000;
              uVar16 = uVar17;
              if ((short)uVar17 < 0) {
                OVar29 = poVar13->mps;
              }
              else {
                OVar26 = poVar13->mps;
                *ppoVar22 = (&poVar13->nmps)[uVar17 < uVar8];
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_00136b13;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00136b13:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar8 <= uVar17) {
                  OVar29 = OVar26;
                }
              }
            }
            ppoVar31 = ppoVar22;
            if (OVar29 != 0) {
              poVar13 = *ppoVar4;
              uVar8 = poVar13->qeval;
              uVar16 = uVar16 - uVar8;
              if (OVar24 >> 0x10 < uVar8) {
                uVar15 = poVar13->mps;
                poVar13 = (&poVar13->nmps)[uVar8 <= uVar16];
                *ppoVar4 = poVar13;
                uVar17 = uVar8;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_00136c78;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00136c78:
                  uVar17 = uVar17 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar17 < 0x8000);
                uVar25 = (uint)(uVar15 == 0);
                if (uVar16 < uVar8) {
                  uVar25 = uVar15;
                }
              }
              else {
                OVar24 = OVar24 + uVar8 * -0x10000;
                uVar17 = uVar16;
                if ((short)uVar16 < 0) {
                  uVar25 = poVar13->mps;
                }
                else {
                  uVar15 = poVar13->mps;
                  poVar13 = (&poVar13->nmps)[uVar16 < uVar8];
                  *ppoVar4 = poVar13;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_00136d0e;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00136d0e:
                    uVar17 = uVar17 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar17 < 0x8000);
                  uVar25 = (uint)(uVar15 == 0);
                  if (uVar8 <= uVar16) {
                    uVar25 = uVar15;
                  }
                }
              }
              uVar8 = poVar13->qeval;
              uVar17 = uVar17 - uVar8;
              if (OVar24 >> 0x10 < uVar8) {
                OVar26 = poVar13->mps;
                *ppoVar4 = (&poVar13->nmps)[uVar8 <= uVar17];
                uVar16 = uVar8;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_00136f5b;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00136f5b:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar17 < uVar8) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar8 * -0x10000;
                uVar16 = uVar17;
                if ((short)uVar17 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar4 = (&poVar13->nmps)[uVar17 < uVar8];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_00136fe7;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00136fe7:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar8 <= uVar17) {
                    OVar29 = OVar26;
                  }
                }
              }
              uVar30 = 0;
              uVar8 = 0;
              ppoVar31 = ppoVar4;
              switch(uVar25 * 2 | OVar29) {
              case 0:
                uVar17 = puVar10[1] >> 0x11 & 4 | puVar10[-1] >> 0x13 & 1;
                bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [uVar17];
                poVar13 = (t1->mqc).ctxs[bVar5];
                uVar8 = poVar13->qeval;
                uVar16 = uVar16 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar8 <= uVar16];
                  uVar15 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_001370f1;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_001370f1:
                    uVar15 = uVar15 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar15 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar16 < uVar8) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar15 = uVar16;
                  if ((short)uVar16 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar16 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_00137b31;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00137b31:
                      uVar15 = uVar15 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar15 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar16) {
                      OVar29 = OVar26;
                    }
                  }
                }
                uVar8 = OVar29 ^ ""[uVar17];
                uVar16 = uVar21;
                if (OVar29 == ""[uVar17]) {
                  uVar16 = uVar20;
                }
                *puVar28 = uVar16;
                *(byte *)(puVar10 + -1) = (byte)puVar10[-1] | 0x20;
                *(byte *)(puVar10 + 1) = (byte)puVar10[1] | 8;
                *(ulong *)(puVar10 + -0x43) =
                     CONCAT44(uVar8 << 0x1f,0x20000) | 0x1000000000000 | *(ulong *)(puVar10 + -0x43)
                ;
                *(byte *)((long)puVar10 + -0x103) = *(byte *)((long)puVar10 + -0x103) | 0x80;
                bVar5 = (t1->mqc).lut_ctxno_zc_orient[2];
                poVar13 = (t1->mqc).ctxs[bVar5];
                uVar17 = poVar13->qeval;
                uVar15 = uVar15 - uVar17;
                if (OVar24 >> 0x10 < uVar17) {
                  OVar26 = poVar13->mps;
                  (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar17 <= uVar15];
                  uVar16 = uVar17;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_00137c59;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00137c59:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar15 < uVar17) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar17 * -0x10000;
                  uVar16 = uVar15;
                  if ((short)uVar15 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 < uVar17];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_00137ce7;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00137ce7:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar17 <= uVar15) {
                      OVar29 = OVar26;
                    }
                  }
                }
                uVar30 = (ulong)(uVar8 << 0x13 | 0x10);
                if (OVar29 != 0) goto switchD_00137059_caseD_1;
                break;
              case 1:
switchD_00137059_caseD_1:
                uVar15 = (uint)(uVar30 >> 0x13) & 0x40 | (uint)(uVar30 >> 3) & 0xaa |
                         (uint)(uVar30 >> 0xf) & 0x10 | puVar10[-1] >> 0x16 & 1 |
                         puVar10[1] >> 0x14 & 4;
                bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [uVar15];
                poVar13 = (t1->mqc).ctxs[bVar5];
                uVar8 = poVar13->qeval;
                uVar17 = uVar16 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar8 <= uVar17];
                  uVar16 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_00137dfd;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00137dfd:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 < uVar8) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar16 = uVar17;
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar17 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_00137e88;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00137e88:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar17) {
                      OVar29 = OVar26;
                    }
                  }
                }
                bVar5 = ""[uVar15];
                uVar8 = uVar21;
                if (OVar29 == bVar5) {
                  uVar8 = uVar20;
                }
                puVar28[0x40] = uVar8;
                *(byte *)((long)puVar10 + -3) = *(byte *)((long)puVar10 + -3) | 1;
                uVar30 = (ulong)((uint)uVar30 | (OVar29 ^ bVar5) << 0x16 | 0x80);
                *(byte *)(puVar10 + 1) = (byte)puVar10[1] | 0x40;
                break;
              case 2:
                goto switchD_00137059_caseD_2;
              case 3:
                goto switchD_00137059_caseD_3;
              default:
                goto switchD_00137059_default;
              }
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 6) & 0x1ef];
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar8 = poVar13->qeval;
              uVar17 = uVar16 - uVar8;
              if (OVar24 >> 0x10 < uVar8) {
                OVar26 = poVar13->mps;
                (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar8 <= uVar17];
                uVar16 = uVar8;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_00137f95;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00137f95:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar17 < uVar8) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar8 * -0x10000;
                uVar16 = uVar17;
                if ((short)uVar17 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar17 < uVar8];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_00138023;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00138023:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar8 <= uVar17) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 != 0) {
switchD_00137059_caseD_2:
                uVar15 = (uint)(uVar30 >> 0x16) & 0x40 | (uint)(uVar30 >> 6) & 0xaa |
                         (uint)(uVar30 >> 0x12) & 0x10 | puVar10[-1] >> 0x19 & 1 |
                         puVar10[1] >> 0x17 & 4;
                bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [uVar15];
                poVar13 = (t1->mqc).ctxs[bVar5];
                uVar8 = poVar13->qeval;
                uVar17 = uVar16 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar8 <= uVar17];
                  uVar16 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_00138131;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00138131:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 < uVar8) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar16 = uVar17;
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar17 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_001381bc;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_001381bc:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar17) {
                      OVar29 = OVar26;
                    }
                  }
                }
                bVar5 = ""[uVar15];
                uVar8 = uVar21;
                if (OVar29 == bVar5) {
                  uVar8 = uVar20;
                }
                puVar28[0x80] = uVar8;
                *(byte *)((long)puVar10 + -3) = *(byte *)((long)puVar10 + -3) | 8;
                uVar30 = (ulong)((uint)uVar30 | (OVar29 ^ bVar5) << 0x19 | 0x400);
                *(byte *)((long)puVar10 + 5) = *(byte *)((long)puVar10 + 5) | 2;
              }
              uVar8 = (uint)uVar30;
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 9) & 0x1ef];
              ppoVar31 = (t1->mqc).ctxs + bVar5;
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar17 = poVar13->qeval;
              uVar15 = uVar16 - uVar17;
              if (OVar24 >> 0x10 < uVar17) {
                OVar26 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
                uVar16 = uVar17;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_001382ce;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_001382ce:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar17) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar17 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_00138355;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00138355:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 != 0) {
switchD_00137059_caseD_3:
                uVar8 = (uint)uVar30;
                uVar30 = (ulong)((uint)(uVar30 >> 0x19) & 0x40 | (uint)(uVar30 >> 9) & 0xaa |
                                 (uint)(uVar30 >> 0x15) & 0x10 | puVar10[-1] >> 0x1c & 1 |
                                puVar10[1] >> 0x1a & 4);
                ppoVar31 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar30];
                poVar13 = *ppoVar31;
                uVar17 = poVar13->qeval;
                uVar15 = uVar16 - uVar17;
                if (OVar24 >> 0x10 < uVar17) {
                  uVar25 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
                  uVar16 = uVar17;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_00138464;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00138464:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  goto LAB_00138487;
                }
                OVar24 = OVar24 + uVar17 * -0x10000;
                if ((short)uVar15 < 0) {
LAB_00138517:
                  uVar32 = poVar13->mps;
                  uVar16 = uVar15;
                }
                else {
                  uVar25 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                  uVar16 = uVar15;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_001384f4;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_001384f4:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
LAB_00138520:
                  uVar32 = (uint)(uVar25 == 0);
                  if (uVar17 <= uVar15) {
                    uVar32 = uVar25;
                  }
                }
                goto LAB_0013852e;
              }
              goto switchD_00137059_default;
            }
          }
          else {
            if ((uVar8 & 0x200010) == 0) {
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar8 & 0x1ef];
              ppoVar31 = (t1->mqc).ctxs + bVar5;
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar17 = poVar13->qeval;
              uVar15 = uVar16 - uVar17;
              if (OVar24 >> 0x10 < uVar17) {
                OVar26 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
                uVar16 = uVar17;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_001369f8;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_001369f8:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar17) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar17 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_00136baf;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00136baf:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 != 0) {
                uVar25 = uVar8 >> 0x10 & 0x40 | uVar8 & 0xaa | uVar8 >> 0xe & 0x10 |
                         puVar10[-1] >> 0x13 & 1 | puVar10[1] >> 0x11 & 4;
                ppoVar31 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar25];
                poVar13 = *ppoVar31;
                uVar17 = poVar13->qeval;
                uVar15 = uVar16 - uVar17;
                if (OVar24 >> 0x10 < uVar17) {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
                  uVar16 = uVar17;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_00136e1f;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00136e1f:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar15 < uVar17) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar17 * -0x10000;
                  uVar16 = uVar15;
                  if ((short)uVar15 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_00136ea3;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00136ea3:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar17 <= uVar15) {
                      OVar29 = OVar26;
                    }
                  }
                }
                uVar15 = OVar29 ^ ""[uVar25];
                uVar17 = uVar21;
                if (OVar29 == ""[uVar25]) {
                  uVar17 = uVar20;
                }
                *puVar28 = uVar17;
                *(byte *)(puVar10 + -1) = (byte)puVar10[-1] | 0x20;
                *(byte *)(puVar10 + 1) = (byte)puVar10[1] | 8;
                *(ulong *)(puVar10 + -0x43) =
                     CONCAT44(uVar15 << 0x1f,0x20000) | 0x1000000000000 |
                     *(ulong *)(puVar10 + -0x43);
                *(byte *)((long)puVar10 + -0x103) = *(byte *)((long)puVar10 + -0x103) | 0x80;
                uVar30 = (ulong)(uVar15 << 0x13 | uVar8 | 0x10);
              }
            }
            if ((uVar30 & 0x1000080) == 0) {
              uVar17 = (uint)(uVar30 >> 3);
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar17 & 0x1ef];
              ppoVar31 = (t1->mqc).ctxs + bVar5;
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar8 = poVar13->qeval;
              uVar15 = uVar16 - uVar8;
              if (OVar24 >> 0x10 < uVar8) {
                OVar26 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar8 <= uVar15];
                uVar16 = uVar8;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_00137235;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00137235:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar8) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar8 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar8];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_001372b9;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_001372b9:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar8 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 != 0) {
                uVar15 = (uint)(uVar30 >> 0x13) & 0x40 | uVar17 & 0xaa |
                         (uint)(uVar30 >> 0xf) & 0x10 | puVar10[-1] >> 0x16 & 1 |
                         puVar10[1] >> 0x14 & 4;
                ppoVar31 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar15];
                poVar13 = *ppoVar31;
                uVar8 = poVar13->qeval;
                uVar17 = uVar16 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar8 <= uVar17];
                  uVar16 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_001373c0;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_001373c0:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 < uVar8) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar16 = uVar17;
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    *ppoVar31 = (&poVar13->nmps)[uVar17 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_00137444;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00137444:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar17) {
                      OVar29 = OVar26;
                    }
                  }
                }
                bVar5 = ""[uVar15];
                uVar8 = uVar21;
                if (OVar29 == bVar5) {
                  uVar8 = uVar20;
                }
                puVar28[0x40] = uVar8;
                *(byte *)((long)puVar10 + -3) = *(byte *)((long)puVar10 + -3) | 1;
                uVar30 = (ulong)((uint)uVar30 | (OVar29 ^ bVar5) << 0x16 | 0x80);
                *(byte *)(puVar10 + 1) = (byte)puVar10[1] | 0x40;
              }
            }
            if ((uVar30 & 0x8000400) == 0) {
              uVar17 = (uint)(uVar30 >> 6);
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar17 & 0x1ef];
              ppoVar31 = (t1->mqc).ctxs + bVar5;
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar8 = poVar13->qeval;
              uVar15 = uVar16 - uVar8;
              if (OVar24 >> 0x10 < uVar8) {
                OVar26 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar8 <= uVar15];
                uVar16 = uVar8;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_00137566;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00137566:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar8) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar8 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar8];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_001375ea;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_001375ea:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar8 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 != 0) {
                uVar15 = (uint)(uVar30 >> 0x16) & 0x40 | uVar17 & 0xaa |
                         (uint)(uVar30 >> 0x12) & 0x10 | puVar10[-1] >> 0x19 & 1 |
                         puVar10[1] >> 0x17 & 4;
                ppoVar31 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar15];
                poVar13 = *ppoVar31;
                uVar8 = poVar13->qeval;
                uVar17 = uVar16 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar8 <= uVar17];
                  uVar16 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_001376f1;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_001376f1:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 < uVar8) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar16 = uVar17;
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    *ppoVar31 = (&poVar13->nmps)[uVar17 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_00137775;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00137775:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar17) {
                      OVar29 = OVar26;
                    }
                  }
                }
                bVar5 = ""[uVar15];
                uVar8 = uVar21;
                if (OVar29 == bVar5) {
                  uVar8 = uVar20;
                }
                puVar28[0x80] = uVar8;
                *(byte *)((long)puVar10 + -3) = *(byte *)((long)puVar10 + -3) | 8;
                uVar30 = (ulong)((uint)uVar30 | (OVar29 ^ bVar5) << 0x19 | 0x400);
                *(byte *)((long)puVar10 + 5) = *(byte *)((long)puVar10 + 5) | 2;
              }
            }
            uVar8 = (uint)uVar30;
            if ((uVar30 & 0x40002000) == 0) {
              uVar25 = (uint)(uVar30 >> 9);
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
              ppoVar31 = (t1->mqc).ctxs + bVar5;
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar17 = poVar13->qeval;
              uVar15 = uVar16 - uVar17;
              if (OVar24 >> 0x10 < uVar17) {
                OVar26 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
                uVar16 = uVar17;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_00137897;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00137897:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar17) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar17 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013791b;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013791b:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 == 0) goto switchD_00137059_default;
              uVar30 = (ulong)((uint)(uVar30 >> 0x19) & 0x40 | uVar25 & 0xaa |
                               (uint)(uVar30 >> 0x15) & 0x10 | puVar10[-1] >> 0x1c & 1 |
                              puVar10[1] >> 0x1a & 4);
              ppoVar31 = (t1->mqc).ctxs +
                         "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                         [uVar30];
              poVar13 = *ppoVar31;
              uVar17 = poVar13->qeval;
              uVar15 = uVar16 - uVar17;
              if (uVar17 <= OVar24 >> 0x10) {
                OVar24 = OVar24 + uVar17 * -0x10000;
                if ((short)uVar15 < 0) goto LAB_00138517;
                uVar25 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                uVar16 = uVar15;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_00137aa2;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00137aa2:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                goto LAB_00138520;
              }
              uVar25 = poVar13->mps;
              *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
              uVar16 = uVar17;
              do {
                if (OVar18 == 0) {
                  pOVar7 = *ppOVar1;
                  bVar5 = pOVar7[1];
                  if (*pOVar7 == 0xff) {
                    if (bVar5 < 0x90) {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x200;
                      OVar18 = 7;
                      goto LAB_00137a1e;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar7 + 1;
                    OVar24 = OVar24 + (uint)bVar5 * 0x100;
                  }
                  OVar18 = 8;
                }
LAB_00137a1e:
                uVar16 = uVar16 * 2;
                OVar24 = OVar24 * 2;
                OVar18 = OVar18 - 1;
              } while (uVar16 < 0x8000);
LAB_00138487:
              uVar32 = (uint)(uVar25 == 0);
              if (uVar15 < uVar17) {
                uVar32 = uVar25;
              }
LAB_0013852e:
              uVar15 = uVar32 ^ ""[uVar30];
              uVar17 = uVar21;
              if (uVar32 == ""[uVar30]) {
                uVar17 = uVar20;
              }
              puVar28[0xc0] = uVar17;
              *(byte *)((long)puVar10 + -3) = *(byte *)((long)puVar10 + -3) | 0x40;
              *(byte *)((long)puVar10 + 5) = *(byte *)((long)puVar10 + 5) | 0x10;
              *(ulong *)(puVar10 + 0x41) =
                   CONCAT44(uVar15 << 0x12,4) | 0x200000000 | *(ulong *)(puVar10 + 0x41);
              *(byte *)(puVar10 + 0x43) = (byte)puVar10[0x43] | 1;
              uVar8 = uVar15 << 0x1c | uVar8 | 0x2000;
            }
switchD_00137059_default:
            *puVar10 = uVar8 & 0xb6dfffff;
          }
          iVar14 = iVar14 + 1;
          puVar9 = puVar10 + 1;
          puVar19 = puVar28 + 1;
        } while (iVar14 != 0x40);
        puVar19 = puVar28 + 0xc1;
        puVar9 = puVar10 + 3;
        bVar34 = uVar11 < 0x3c;
        uVar11 = uVar11 + 4;
      } while (bVar34);
    }
    else {
      uVar11 = 0;
      do {
        iVar14 = 0;
        do {
          puVar28 = puVar19;
          puVar10 = puVar9;
          uVar8 = *puVar10;
          uVar30 = (ulong)uVar8;
          if (uVar30 == 0) {
            poVar13 = *ppoVar22;
            uVar8 = poVar13->qeval;
            uVar17 = uVar16 - uVar8;
            if (OVar24 >> 0x10 < uVar8) {
              OVar26 = poVar13->mps;
              *ppoVar22 = (&poVar13->nmps)[uVar8 <= uVar17];
              uVar16 = uVar8;
              do {
                if (OVar18 == 0) {
                  pOVar7 = *ppOVar1;
                  bVar5 = pOVar7[1];
                  if (*pOVar7 == 0xff) {
                    if (bVar5 < 0x90) {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x200;
                      OVar18 = 7;
                      goto LAB_0013c26b;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar7 + 1;
                    OVar24 = OVar24 + (uint)bVar5 * 0x100;
                  }
                  OVar18 = 8;
                }
LAB_0013c26b:
                uVar16 = uVar16 * 2;
                OVar24 = OVar24 * 2;
                OVar18 = OVar18 - 1;
              } while (uVar16 < 0x8000);
              OVar29 = (uint)(OVar26 == 0);
              if (uVar17 < uVar8) {
                OVar29 = OVar26;
              }
            }
            else {
              OVar24 = OVar24 + uVar8 * -0x10000;
              uVar16 = uVar17;
              if ((short)uVar17 < 0) {
                OVar29 = poVar13->mps;
              }
              else {
                OVar26 = poVar13->mps;
                *ppoVar22 = (&poVar13->nmps)[uVar17 < uVar8];
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_0013c2f9;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_0013c2f9:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar8 <= uVar17) {
                  OVar29 = OVar26;
                }
              }
            }
            ppoVar31 = ppoVar22;
            if (OVar29 != 0) {
              poVar13 = *ppoVar4;
              uVar8 = poVar13->qeval;
              uVar16 = uVar16 - uVar8;
              if (OVar24 >> 0x10 < uVar8) {
                OVar26 = poVar13->mps;
                poVar13 = (&poVar13->nmps)[uVar8 <= uVar16];
                *ppoVar4 = poVar13;
                uVar17 = uVar8;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_0013c467;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_0013c467:
                  uVar17 = uVar17 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar17 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar16 < uVar8) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar8 * -0x10000;
                uVar17 = uVar16;
                if ((short)uVar16 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  poVar13 = (&poVar13->nmps)[uVar16 < uVar8];
                  *ppoVar4 = poVar13;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013c501;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013c501:
                    uVar17 = uVar17 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar17 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar8 <= uVar16) {
                    OVar29 = OVar26;
                  }
                }
              }
              uVar8 = poVar13->qeval;
              uVar17 = uVar17 - uVar8;
              if (OVar24 >> 0x10 < uVar8) {
                OVar26 = poVar13->mps;
                *ppoVar4 = (&poVar13->nmps)[uVar8 <= uVar17];
                uVar16 = uVar8;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_0013c752;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_0013c752:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar27 = (uint)(OVar26 == 0);
                if (uVar17 < uVar8) {
                  OVar27 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar8 * -0x10000;
                uVar16 = uVar17;
                if ((short)uVar17 < 0) {
                  OVar27 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar4 = (&poVar13->nmps)[uVar17 < uVar8];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013c7e2;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013c7e2:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar27 = (uint)(OVar26 == 0);
                  if (uVar8 <= uVar17) {
                    OVar27 = OVar26;
                  }
                }
              }
              uVar17 = 0;
              uVar30 = 0;
              uVar8 = 0;
              ppoVar31 = ppoVar4;
              switch(OVar29 * 2 | OVar27) {
              case 0:
                uVar17 = puVar10[1] >> 0x11 & 4 | puVar10[-1] >> 0x13 & 1;
                bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [uVar17];
                poVar13 = (t1->mqc).ctxs[bVar5];
                uVar8 = poVar13->qeval;
                uVar16 = uVar16 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar8 <= uVar16];
                  uVar15 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013c8f1;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013c8f1:
                    uVar15 = uVar15 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar15 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar16 < uVar8) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar15 = uVar16;
                  if ((short)uVar16 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar16 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_0013d311;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0013d311:
                      uVar15 = uVar15 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar15 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar16) {
                      OVar29 = OVar26;
                    }
                  }
                }
                bVar5 = ""[uVar17];
                uVar16 = uVar21;
                if (OVar29 == bVar5) {
                  uVar16 = uVar20;
                }
                *puVar28 = uVar16;
                *(byte *)(puVar10 + -1) = (byte)puVar10[-1] | 0x20;
                *(byte *)(puVar10 + 1) = (byte)puVar10[1] | 8;
                bVar6 = (t1->mqc).lut_ctxno_zc_orient[2];
                poVar13 = (t1->mqc).ctxs[bVar6];
                uVar8 = poVar13->qeval;
                uVar15 = uVar15 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar13->nmps)[uVar8 <= uVar15];
                  uVar16 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar6 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar6 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013d406;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar6 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013d406:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar27 = (uint)(OVar26 == 0);
                  if (uVar15 < uVar8) {
                    OVar27 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar16 = uVar15;
                  if ((short)uVar15 < 0) {
                    OVar27 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar13->nmps)[uVar15 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar6 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar6 * 0x200;
                            OVar18 = 7;
                            goto LAB_0013d497;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar6 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0013d497:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar27 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar15) {
                      OVar27 = OVar26;
                    }
                  }
                }
                uVar17 = (OVar29 ^ bVar5) << 0x13 | 0x10;
                if (OVar27 != 0) goto switchD_0013c854_caseD_1;
                break;
              case 1:
switchD_0013c854_caseD_1:
                uVar25 = uVar17 >> 0x13 & 0x40 | uVar17 >> 3 & 0xaa | uVar17 >> 0xf & 0x10 |
                         puVar10[-1] >> 0x16 & 1 | puVar10[1] >> 0x14 & 4;
                bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [uVar25];
                poVar13 = (t1->mqc).ctxs[bVar5];
                uVar8 = poVar13->qeval;
                uVar15 = uVar16 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar8 <= uVar15];
                  uVar16 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013d5b7;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013d5b7:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar15 < uVar8) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar16 = uVar15;
                  if ((short)uVar15 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_0013d648;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0013d648:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar15) {
                      OVar29 = OVar26;
                    }
                  }
                }
                bVar5 = ""[uVar25];
                uVar8 = uVar21;
                if (OVar29 == bVar5) {
                  uVar8 = uVar20;
                }
                puVar28[0x40] = uVar8;
                *(byte *)((long)puVar10 + -3) = *(byte *)((long)puVar10 + -3) | 1;
                uVar17 = uVar17 | (OVar29 ^ bVar5) << 0x16 | 0x80;
                *(byte *)(puVar10 + 1) = (byte)puVar10[1] | 0x40;
                break;
              case 2:
                goto switchD_0013c854_caseD_2;
              case 3:
                goto LAB_0013db8f;
              default:
                goto switchD_0013c854_default;
              }
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar17 >> 6 & 0x1ef];
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar8 = poVar13->qeval;
              uVar15 = uVar16 - uVar8;
              if (OVar24 >> 0x10 < uVar8) {
                OVar26 = poVar13->mps;
                (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar8 <= uVar15];
                uVar16 = uVar8;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_0013d75e;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_0013d75e:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar8) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar8 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 < uVar8];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013d7f1;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013d7f1:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar8 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              uVar8 = uVar17;
              if (OVar29 != 0) {
switchD_0013c854_caseD_2:
                uVar25 = uVar17 >> 0x16 & 0x40 | uVar17 >> 6 & 0xaa | uVar17 >> 0x12 & 0x10 |
                         puVar10[-1] >> 0x19 & 1 | puVar10[1] >> 0x17 & 4;
                bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [uVar25];
                poVar13 = (t1->mqc).ctxs[bVar5];
                uVar8 = poVar13->qeval;
                uVar15 = uVar16 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar8 <= uVar15];
                  uVar16 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013d907;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013d907:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar15 < uVar8) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar16 = uVar15;
                  if ((short)uVar15 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_0013d998;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0013d998:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar15) {
                      OVar29 = OVar26;
                    }
                  }
                }
                bVar5 = ""[uVar25];
                uVar8 = uVar21;
                if (OVar29 == bVar5) {
                  uVar8 = uVar20;
                }
                puVar28[0x80] = uVar8;
                *(byte *)((long)puVar10 + -3) = *(byte *)((long)puVar10 + -3) | 8;
                *(byte *)((long)puVar10 + 5) = *(byte *)((long)puVar10 + 5) | 2;
                uVar8 = uVar17 | (OVar29 ^ bVar5) << 0x19 | 0x400;
              }
              uVar30 = (ulong)uVar8;
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar8 >> 9 & 0x1ef];
              ppoVar31 = (t1->mqc).ctxs + bVar5;
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar17 = poVar13->qeval;
              uVar15 = uVar16 - uVar17;
              if (OVar24 >> 0x10 < uVar17) {
                OVar26 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
                uVar16 = uVar17;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_0013daac;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_0013daac:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar17) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar17 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013db35;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013db35:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 != 0) {
LAB_0013db8f:
                uVar8 = (uint)uVar30;
                uVar30 = (ulong)((uint)(uVar30 >> 0x19) & 0x40 | (uint)(uVar30 >> 9) & 0xaa |
                                 (uint)(uVar30 >> 0x15) & 0x10 | puVar10[-1] >> 0x1c & 1 |
                                puVar10[1] >> 0x1a & 4);
                ppoVar31 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar30];
                poVar13 = *ppoVar31;
                uVar17 = poVar13->qeval;
                uVar15 = uVar16 - uVar17;
                if (OVar24 >> 0x10 < uVar17) {
                  uVar25 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
                  uVar16 = uVar17;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013dc49;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013dc49:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  goto LAB_0013dc6c;
                }
                OVar24 = OVar24 + uVar17 * -0x10000;
                if ((short)uVar15 < 0) {
LAB_0013dcfc:
                  uVar32 = poVar13->mps;
                  uVar16 = uVar15;
                }
                else {
                  uVar25 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                  uVar16 = uVar15;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013dcd9;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013dcd9:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
LAB_0013dd05:
                  uVar32 = (uint)(uVar25 == 0);
                  if (uVar17 <= uVar15) {
                    uVar32 = uVar25;
                  }
                }
                goto LAB_0013dd13;
              }
              goto switchD_0013c854_default;
            }
          }
          else {
            if ((uVar8 & 0x200010) == 0) {
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar8 & 0x1ef];
              ppoVar31 = (t1->mqc).ctxs + bVar5;
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar17 = poVar13->qeval;
              uVar15 = uVar16 - uVar17;
              if (OVar24 >> 0x10 < uVar17) {
                OVar26 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
                uVar16 = uVar17;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_0013c1da;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_0013c1da:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar17) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar17 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013c395;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013c395:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 != 0) {
                uVar25 = uVar8 >> 0x10 & 0x40 | uVar8 & 0xaa | uVar8 >> 0xe & 0x10 |
                         puVar10[-1] >> 0x13 & 1 | puVar10[1] >> 0x11 & 4;
                ppoVar31 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar25];
                poVar13 = *ppoVar31;
                uVar17 = poVar13->qeval;
                uVar15 = uVar16 - uVar17;
                if (OVar24 >> 0x10 < uVar17) {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
                  uVar16 = uVar17;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013c612;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013c612:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar15 < uVar17) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar17 * -0x10000;
                  uVar16 = uVar15;
                  if ((short)uVar15 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_0013c696;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0013c696:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar17 <= uVar15) {
                      OVar29 = OVar26;
                    }
                  }
                }
                bVar5 = ""[uVar25];
                uVar17 = uVar21;
                if (OVar29 == bVar5) {
                  uVar17 = uVar20;
                }
                *puVar28 = uVar17;
                *(byte *)(puVar10 + -1) = (byte)puVar10[-1] | 0x20;
                *(byte *)(puVar10 + 1) = (byte)puVar10[1] | 8;
                uVar30 = (ulong)((OVar29 ^ bVar5) << 0x13 | uVar8 | 0x10);
              }
            }
            if ((uVar30 & 0x1000080) == 0) {
              uVar17 = (uint)(uVar30 >> 3);
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar17 & 0x1ef];
              ppoVar31 = (t1->mqc).ctxs + bVar5;
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar8 = poVar13->qeval;
              uVar15 = uVar16 - uVar8;
              if (OVar24 >> 0x10 < uVar8) {
                OVar26 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar8 <= uVar15];
                uVar16 = uVar8;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_0013ca0d;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_0013ca0d:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar8) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar8 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar8];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013ca91;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013ca91:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar8 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 != 0) {
                uVar15 = (uint)(uVar30 >> 0x13) & 0x40 | uVar17 & 0xaa |
                         (uint)(uVar30 >> 0xf) & 0x10 | puVar10[-1] >> 0x16 & 1 |
                         puVar10[1] >> 0x14 & 4;
                ppoVar31 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar15];
                poVar13 = *ppoVar31;
                uVar8 = poVar13->qeval;
                uVar17 = uVar16 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar8 <= uVar17];
                  uVar16 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013cb98;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013cb98:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 < uVar8) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar16 = uVar17;
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    *ppoVar31 = (&poVar13->nmps)[uVar17 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_0013cc1c;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0013cc1c:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar17) {
                      OVar29 = OVar26;
                    }
                  }
                }
                bVar5 = ""[uVar15];
                uVar8 = uVar21;
                if (OVar29 == bVar5) {
                  uVar8 = uVar20;
                }
                puVar28[0x40] = uVar8;
                *(byte *)((long)puVar10 + -3) = *(byte *)((long)puVar10 + -3) | 1;
                uVar30 = (ulong)((uint)uVar30 | (OVar29 ^ bVar5) << 0x16 | 0x80);
                *(byte *)(puVar10 + 1) = (byte)puVar10[1] | 0x40;
              }
            }
            if ((uVar30 & 0x8000400) == 0) {
              uVar17 = (uint)(uVar30 >> 6);
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar17 & 0x1ef];
              ppoVar31 = (t1->mqc).ctxs + bVar5;
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar8 = poVar13->qeval;
              uVar15 = uVar16 - uVar8;
              if (OVar24 >> 0x10 < uVar8) {
                OVar26 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar8 <= uVar15];
                uVar16 = uVar8;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_0013cd41;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_0013cd41:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar8) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar8 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar8];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013cdc5;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013cdc5:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar8 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 != 0) {
                uVar15 = (uint)(uVar30 >> 0x16) & 0x40 | uVar17 & 0xaa |
                         (uint)(uVar30 >> 0x12) & 0x10 | puVar10[-1] >> 0x19 & 1 |
                         puVar10[1] >> 0x17 & 4;
                ppoVar31 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar15];
                poVar13 = *ppoVar31;
                uVar8 = poVar13->qeval;
                uVar17 = uVar16 - uVar8;
                if (OVar24 >> 0x10 < uVar8) {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar8 <= uVar17];
                  uVar16 = uVar8;
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013cecc;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013cecc:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 < uVar8) {
                    OVar29 = OVar26;
                  }
                }
                else {
                  OVar24 = OVar24 + uVar8 * -0x10000;
                  uVar16 = uVar17;
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar13->mps;
                  }
                  else {
                    OVar26 = poVar13->mps;
                    *ppoVar31 = (&poVar13->nmps)[uVar17 < uVar8];
                    do {
                      if (OVar18 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            OVar24 = OVar24 + (uint)bVar5 * 0x200;
                            OVar18 = 7;
                            goto LAB_0013cf50;
                          }
                          OVar24 = OVar24 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0013cf50:
                      uVar16 = uVar16 * 2;
                      OVar24 = OVar24 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                    OVar29 = (uint)(OVar26 == 0);
                    if (uVar8 <= uVar17) {
                      OVar29 = OVar26;
                    }
                  }
                }
                bVar5 = ""[uVar15];
                uVar8 = uVar21;
                if (OVar29 == bVar5) {
                  uVar8 = uVar20;
                }
                puVar28[0x80] = uVar8;
                *(byte *)((long)puVar10 + -3) = *(byte *)((long)puVar10 + -3) | 8;
                uVar30 = (ulong)((uint)uVar30 | (OVar29 ^ bVar5) << 0x19 | 0x400);
                *(byte *)((long)puVar10 + 5) = *(byte *)((long)puVar10 + 5) | 2;
              }
            }
            uVar8 = (uint)uVar30;
            if ((uVar30 & 0x40002000) == 0) {
              uVar25 = (uint)(uVar30 >> 9);
              bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
              ppoVar31 = (t1->mqc).ctxs + bVar5;
              poVar13 = (t1->mqc).ctxs[bVar5];
              uVar17 = poVar13->qeval;
              uVar15 = uVar16 - uVar17;
              if (OVar24 >> 0x10 < uVar17) {
                OVar26 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
                uVar16 = uVar17;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_0013d072;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_0013d072:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                OVar29 = (uint)(OVar26 == 0);
                if (uVar15 < uVar17) {
                  OVar29 = OVar26;
                }
              }
              else {
                OVar24 = OVar24 + uVar17 * -0x10000;
                uVar16 = uVar15;
                if ((short)uVar15 < 0) {
                  OVar29 = poVar13->mps;
                }
                else {
                  OVar26 = poVar13->mps;
                  *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                  do {
                    if (OVar18 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          OVar24 = OVar24 + (uint)bVar5 * 0x200;
                          OVar18 = 7;
                          goto LAB_0013d0f6;
                        }
                        OVar24 = OVar24 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0013d0f6:
                    uVar16 = uVar16 * 2;
                    OVar24 = OVar24 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                  OVar29 = (uint)(OVar26 == 0);
                  if (uVar17 <= uVar15) {
                    OVar29 = OVar26;
                  }
                }
              }
              if (OVar29 == 0) goto switchD_0013c854_default;
              uVar30 = (ulong)((uint)(uVar30 >> 0x19) & 0x40 | uVar25 & 0xaa |
                               (uint)(uVar30 >> 0x15) & 0x10 | puVar10[-1] >> 0x1c & 1 |
                              puVar10[1] >> 0x1a & 4);
              ppoVar31 = (t1->mqc).ctxs +
                         "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                         [uVar30];
              poVar13 = *ppoVar31;
              uVar17 = poVar13->qeval;
              uVar15 = uVar16 - uVar17;
              if (uVar17 <= OVar24 >> 0x10) {
                OVar24 = OVar24 + uVar17 * -0x10000;
                if ((short)uVar15 < 0) goto LAB_0013dcfc;
                uVar25 = poVar13->mps;
                *ppoVar31 = (&poVar13->nmps)[uVar15 < uVar17];
                uVar16 = uVar15;
                do {
                  if (OVar18 == 0) {
                    pOVar7 = *ppOVar1;
                    bVar5 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar5 < 0x90) {
                        *ppOVar1 = pOVar7 + 1;
                        OVar24 = OVar24 + (uint)bVar5 * 0x200;
                        OVar18 = 7;
                        goto LAB_0013d27d;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_0013d27d:
                  uVar16 = uVar16 * 2;
                  OVar24 = OVar24 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
                goto LAB_0013dd05;
              }
              uVar25 = poVar13->mps;
              *ppoVar31 = (&poVar13->nmps)[uVar17 <= uVar15];
              uVar16 = uVar17;
              do {
                if (OVar18 == 0) {
                  pOVar7 = *ppOVar1;
                  bVar5 = pOVar7[1];
                  if (*pOVar7 == 0xff) {
                    if (bVar5 < 0x90) {
                      *ppOVar1 = pOVar7 + 1;
                      OVar24 = OVar24 + (uint)bVar5 * 0x200;
                      OVar18 = 7;
                      goto LAB_0013d1f9;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar7 + 1;
                    OVar24 = OVar24 + (uint)bVar5 * 0x100;
                  }
                  OVar18 = 8;
                }
LAB_0013d1f9:
                uVar16 = uVar16 * 2;
                OVar24 = OVar24 * 2;
                OVar18 = OVar18 - 1;
              } while (uVar16 < 0x8000);
LAB_0013dc6c:
              uVar32 = (uint)(uVar25 == 0);
              if (uVar15 < uVar17) {
                uVar32 = uVar25;
              }
LAB_0013dd13:
              uVar15 = uVar32 ^ ""[uVar30];
              uVar17 = uVar21;
              if (uVar32 == ""[uVar30]) {
                uVar17 = uVar20;
              }
              puVar28[0xc0] = uVar17;
              *(byte *)((long)puVar10 + -3) = *(byte *)((long)puVar10 + -3) | 0x40;
              *(byte *)((long)puVar10 + 5) = *(byte *)((long)puVar10 + 5) | 0x10;
              *(ulong *)(puVar10 + 0x41) =
                   CONCAT44(uVar15 << 0x12,4) | 0x200000000 | *(ulong *)(puVar10 + 0x41);
              *(byte *)(puVar10 + 0x43) = (byte)puVar10[0x43] | 1;
              uVar8 = uVar15 << 0x1c | uVar8 | 0x2000;
            }
switchD_0013c854_default:
            *puVar10 = uVar8 & 0xb6dfffff;
          }
          iVar14 = iVar14 + 1;
          puVar9 = puVar10 + 1;
          puVar19 = puVar28 + 1;
        } while (iVar14 != 0x40);
        puVar19 = puVar28 + 0xc1;
        puVar9 = puVar10 + 3;
        bVar34 = uVar11 < 0x3c;
        uVar11 = uVar11 + 4;
      } while (bVar34);
    }
    (t1->mqc).curctx = ppoVar31;
    (t1->mqc).c = OVar24;
    (t1->mqc).a = uVar16;
    (t1->mqc).ct = OVar18;
  }
  else {
    flagsp = t1->flags + (uVar16 + 3);
    uVar8 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    puVar19 = (uint *)t1->data;
    ppoVar22 = (t1->mqc).curctx;
    uVar20 = (t1->mqc).c;
    uVar21 = (t1->mqc).a;
    OVar24 = (t1->mqc).ct;
    uVar11 = t1->h;
    if ((cblksty & 8U) == 0) {
      if (uVar11 < 4) {
        local_60 = 0;
      }
      else {
        ppOVar1 = &(t1->mqc).bp;
        uVar17 = -uVar8;
        ppoVar4 = (t1->mqc).ctxs + 0x11;
        ppoVar31 = (t1->mqc).ctxs + 0x12;
        local_60 = 0;
        do {
          if (uVar30 != 0) {
            uVar11 = 0;
            do {
              uVar15 = *flagsp;
              uVar12 = (ulong)uVar15;
              if (uVar12 == 0) {
                poVar13 = *ppoVar4;
                uVar15 = poVar13->qeval;
                uVar25 = uVar21 - uVar15;
                if (uVar20 >> 0x10 < uVar15) {
                  OVar18 = poVar13->mps;
                  *ppoVar4 = (&poVar13->nmps)[uVar15 <= uVar25];
                  uVar21 = uVar15;
                  do {
                    if (OVar24 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x200;
                          OVar24 = 7;
                          goto LAB_001387f6;
                        }
                        uVar20 = uVar20 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        uVar20 = uVar20 + (uint)bVar5 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_001387f6:
                    uVar21 = uVar21 * 2;
                    uVar20 = uVar20 * 2;
                    OVar24 = OVar24 - 1;
                  } while (uVar21 < 0x8000);
                  OVar26 = (uint)(OVar18 == 0);
                  if (uVar25 < uVar15) {
                    OVar26 = OVar18;
                  }
                }
                else {
                  uVar20 = uVar20 + uVar15 * -0x10000;
                  uVar21 = uVar25;
                  if ((short)uVar25 < 0) {
                    OVar26 = poVar13->mps;
                  }
                  else {
                    OVar18 = poVar13->mps;
                    *ppoVar4 = (&poVar13->nmps)[uVar25 < uVar15];
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013887c;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013887c:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar15 <= uVar25) {
                      OVar26 = OVar18;
                    }
                  }
                }
                ppoVar22 = ppoVar4;
                if (OVar26 != 0) {
                  poVar13 = *ppoVar31;
                  uVar15 = poVar13->qeval;
                  uVar21 = uVar21 - uVar15;
                  if (uVar20 >> 0x10 < uVar15) {
                    uVar32 = poVar13->mps;
                    poVar13 = (&poVar13->nmps)[uVar15 <= uVar21];
                    *ppoVar31 = poVar13;
                    uVar25 = uVar15;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_001389d8;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_001389d8:
                      uVar25 = uVar25 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar25 < 0x8000);
                    uVar33 = (uint)(uVar32 == 0);
                    if (uVar21 < uVar15) {
                      uVar33 = uVar32;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar15 * -0x10000;
                    uVar25 = uVar21;
                    if ((short)uVar21 < 0) {
                      uVar33 = poVar13->mps;
                    }
                    else {
                      uVar32 = poVar13->mps;
                      poVar13 = (&poVar13->nmps)[uVar21 < uVar15];
                      *ppoVar31 = poVar13;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00138a65;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00138a65:
                        uVar25 = uVar25 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar25 < 0x8000);
                      uVar33 = (uint)(uVar32 == 0);
                      if (uVar15 <= uVar21) {
                        uVar33 = uVar32;
                      }
                    }
                  }
                  uVar15 = poVar13->qeval;
                  uVar25 = uVar25 - uVar15;
                  if (uVar20 >> 0x10 < uVar15) {
                    OVar18 = poVar13->mps;
                    *ppoVar31 = (&poVar13->nmps)[uVar15 <= uVar25];
                    uVar21 = uVar15;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_00138ca1;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_00138ca1:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar25 < uVar15) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar15 * -0x10000;
                    uVar21 = uVar25;
                    if ((short)uVar25 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar31 = (&poVar13->nmps)[uVar25 < uVar15];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00138d26;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00138d26:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar15 <= uVar25) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  uVar12 = 0;
                  uVar15 = 0;
                  ppoVar22 = ppoVar31;
                  switch(uVar33 * 2 | OVar26) {
                  case 0:
                    uVar25 = flagsp[1] >> 0x11 & 4 | flagsp[-1] >> 0x13 & 1;
                    bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                            [uVar25];
                    poVar13 = (t1->mqc).ctxs[bVar5];
                    uVar15 = poVar13->qeval;
                    uVar21 = uVar21 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 <= uVar21];
                      uVar32 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00138e1f;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00138e1f:
                        uVar32 = uVar32 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar32 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar21 < uVar15) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar32 = uVar21;
                      if ((short)uVar21 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar21 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_0013984e;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_0013984e:
                          uVar32 = uVar32 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar32 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar21) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    uVar15 = OVar26 ^ ""[uVar25];
                    uVar21 = uVar17;
                    if (OVar26 == ""[uVar25]) {
                      uVar21 = uVar8;
                    }
                    *puVar19 = uVar21;
                    *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
                    uVar12 = (ulong)(t1->w + 2);
                    *(ulong *)(flagsp + (-1 - uVar12)) =
                         CONCAT44(uVar15 << 0x1f,0x20000) | 0x1000000000000 |
                         *(ulong *)(flagsp + (-1 - uVar12));
                    pbVar3 = (byte *)((long)flagsp + uVar12 * -4 + 5);
                    *pbVar3 = *pbVar3 | 0x80;
                    bVar5 = (t1->mqc).lut_ctxno_zc_orient[2];
                    poVar13 = (t1->mqc).ctxs[bVar5];
                    uVar25 = poVar13->qeval;
                    uVar32 = uVar32 - uVar25;
                    if (uVar20 >> 0x10 < uVar25) {
                      OVar18 = poVar13->mps;
                      (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar25 <= uVar32];
                      uVar21 = uVar25;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00139980;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00139980:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar25) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar25 * -0x10000;
                      uVar21 = uVar32;
                      if ((short)uVar32 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar32 < uVar25];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_00139a0c;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_00139a0c:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar25 <= uVar32) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    uVar12 = (ulong)(uVar15 << 0x13 | 0x10);
                    if (OVar26 != 0) goto switchD_00138d91_caseD_1;
                    break;
                  case 1:
switchD_00138d91_caseD_1:
                    uVar25 = (uint)(uVar12 >> 0x13) & 0x40 | (uint)(uVar12 >> 3) & 0xaa |
                             (uint)(uVar12 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 |
                             flagsp[1] >> 0x14 & 4;
                    bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                            [uVar25];
                    poVar13 = (t1->mqc).ctxs[bVar5];
                    uVar15 = poVar13->qeval;
                    uVar32 = uVar21 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 <= uVar32];
                      uVar21 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00139b1b;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00139b1b:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar15) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar21 = uVar32;
                      if ((short)uVar32 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar32 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_00139ba4;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_00139ba4:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar32) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    bVar5 = ""[uVar25];
                    uVar15 = uVar17;
                    if (OVar26 == bVar5) {
                      uVar15 = uVar8;
                    }
                    puVar19[uVar30] = uVar15;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
                    uVar12 = (ulong)((uint)uVar12 | (OVar26 ^ bVar5) << 0x16 | 0x80);
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
                    break;
                  case 2:
                    goto switchD_00138d91_caseD_2;
                  case 3:
                    goto switchD_00138d91_caseD_3;
                  default:
                    goto switchD_00138d91_default;
                  }
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar12 >> 6) & 0x1ef];
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar15 = poVar13->qeval;
                  uVar25 = uVar21 - uVar15;
                  if (uVar20 >> 0x10 < uVar15) {
                    OVar18 = poVar13->mps;
                    (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 <= uVar25];
                    uVar21 = uVar15;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_00139cb1;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_00139cb1:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar25 < uVar15) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar15 * -0x10000;
                    uVar21 = uVar25;
                    if ((short)uVar25 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar25 < uVar15];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00139d3d;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00139d3d:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar15 <= uVar25) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 != 0) {
switchD_00138d91_caseD_2:
                    uVar25 = (uint)(uVar12 >> 0x16) & 0x40 | (uint)(uVar12 >> 6) & 0xaa |
                             (uint)(uVar12 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 |
                             flagsp[1] >> 0x17 & 4;
                    bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                            [uVar25];
                    poVar13 = (t1->mqc).ctxs[bVar5];
                    uVar15 = poVar13->qeval;
                    uVar32 = uVar21 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 <= uVar32];
                      uVar21 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00139e44;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00139e44:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar15) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar21 = uVar32;
                      if ((short)uVar32 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar32 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_00139ecd;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_00139ecd:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar32) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    bVar5 = ""[uVar25];
                    uVar15 = uVar17;
                    if (OVar26 == bVar5) {
                      uVar15 = uVar8;
                    }
                    puVar19[uVar16 * 2] = uVar15;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
                    uVar12 = (ulong)((uint)uVar12 | (OVar26 ^ bVar5) << 0x19 | 0x400);
                    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
                  }
                  uVar15 = (uint)uVar12;
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar12 >> 9) & 0x1ef];
                  ppoVar22 = (t1->mqc).ctxs + bVar5;
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar25 = poVar13->qeval;
                  uVar32 = uVar21 - uVar25;
                  if (uVar20 >> 0x10 < uVar25) {
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar32];
                    uVar21 = uVar25;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_00139fdf;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_00139fdf:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar32 < uVar25) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar25 * -0x10000;
                    uVar21 = uVar32;
                    if ((short)uVar32 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar25];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013a063;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013a063:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar25 <= uVar32) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 != 0) {
switchD_00138d91_caseD_3:
                    uVar15 = (uint)uVar12;
                    uVar12 = (ulong)((uint)(uVar12 >> 0x19) & 0x40 | (uint)(uVar12 >> 9) & 0xaa |
                                     (uint)(uVar12 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 |
                                    flagsp[1] >> 0x1a & 4);
                    ppoVar22 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar12];
                    poVar13 = *ppoVar22;
                    uVar25 = poVar13->qeval;
                    uVar32 = uVar21 - uVar25;
                    if (uVar20 >> 0x10 < uVar25) {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar32];
                      uVar21 = uVar25;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013a172;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013a172:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      goto LAB_0013a195;
                    }
                    uVar20 = uVar20 + uVar25 * -0x10000;
                    if ((short)uVar32 < 0) {
LAB_0013a227:
                      uVar21 = uVar32;
                      uVar33 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar25];
                      uVar21 = uVar32;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013a204;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013a204:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
LAB_0013a230:
                      uVar33 = (uint)(OVar18 == 0);
                      if (uVar25 <= uVar32) {
                        uVar33 = OVar18;
                      }
                    }
                    goto LAB_0013a240;
                  }
                  goto switchD_00138d91_default;
                }
              }
              else {
                if ((uVar15 & 0x200010) == 0) {
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar15 & 0x1ef];
                  ppoVar22 = (t1->mqc).ctxs + bVar5;
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar25 = poVar13->qeval;
                  uVar32 = uVar21 - uVar25;
                  if (uVar20 >> 0x10 < uVar25) {
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar32];
                    uVar21 = uVar25;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013876b;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013876b:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar32 < uVar25) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar25 * -0x10000;
                    uVar21 = uVar32;
                    if ((short)uVar32 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar25];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00138915;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00138915:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar25 <= uVar32) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 != 0) {
                    uVar32 = uVar15 >> 0x10 & 0x40 | uVar15 & 0xaa | uVar15 >> 0xe & 0x10 |
                             flagsp[-1] >> 0x13 & 1 | flagsp[1] >> 0x11 & 4;
                    ppoVar22 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar32];
                    poVar13 = *ppoVar22;
                    uVar25 = poVar13->qeval;
                    uVar33 = uVar21 - uVar25;
                    if (uVar20 >> 0x10 < uVar25) {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar33];
                      uVar21 = uVar25;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00138b70;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00138b70:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar33 < uVar25) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar25 * -0x10000;
                      uVar21 = uVar33;
                      if ((short)uVar33 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        *ppoVar22 = (&poVar13->nmps)[uVar33 < uVar25];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_00138bf2;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_00138bf2:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar25 <= uVar33) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    uVar33 = OVar26 ^ ""[uVar32];
                    uVar25 = uVar17;
                    if (OVar26 == ""[uVar32]) {
                      uVar25 = uVar8;
                    }
                    *puVar19 = uVar25;
                    *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
                    uVar12 = (ulong)(t1->w + 2);
                    *(ulong *)(flagsp + (-1 - uVar12)) =
                         CONCAT44(uVar33 << 0x1f,0x20000) | 0x1000000000000 |
                         *(ulong *)(flagsp + (-1 - uVar12));
                    pbVar3 = (byte *)((long)flagsp + uVar12 * -4 + 5);
                    *pbVar3 = *pbVar3 | 0x80;
                    uVar12 = (ulong)(uVar33 << 0x13 | uVar15 | 0x10);
                  }
                }
                if ((uVar12 & 0x1000080) == 0) {
                  uVar25 = (uint)(uVar12 >> 3);
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
                  ppoVar22 = (t1->mqc).ctxs + bVar5;
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar15 = poVar13->qeval;
                  uVar32 = uVar21 - uVar15;
                  if (uVar20 >> 0x10 < uVar15) {
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar15 <= uVar32];
                    uVar21 = uVar15;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_00138f7e;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_00138f7e:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar32 < uVar15) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar15 * -0x10000;
                    uVar21 = uVar32;
                    if ((short)uVar32 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar15];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00138ffc;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00138ffc:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar15 <= uVar32) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 != 0) {
                    uVar25 = (uint)(uVar12 >> 0x13) & 0x40 | uVar25 & 0xaa |
                             (uint)(uVar12 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 |
                             flagsp[1] >> 0x14 & 4;
                    ppoVar22 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar13 = *ppoVar22;
                    uVar15 = poVar13->qeval;
                    uVar32 = uVar21 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar15 <= uVar32];
                      uVar21 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00139100;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00139100:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar15) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar21 = uVar32;
                      if ((short)uVar32 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_0013917e;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_0013917e:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar32) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    bVar5 = ""[uVar25];
                    uVar15 = uVar17;
                    if (OVar26 == bVar5) {
                      uVar15 = uVar8;
                    }
                    puVar19[uVar30] = uVar15;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
                    uVar12 = (ulong)((uint)uVar12 | (OVar26 ^ bVar5) << 0x16 | 0x80);
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
                  }
                }
                if ((uVar12 & 0x8000400) == 0) {
                  uVar25 = (uint)(uVar12 >> 6);
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
                  ppoVar22 = (t1->mqc).ctxs + bVar5;
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar15 = poVar13->qeval;
                  uVar32 = uVar21 - uVar15;
                  if (uVar20 >> 0x10 < uVar15) {
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar15 <= uVar32];
                    uVar21 = uVar15;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_001392a0;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_001392a0:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar32 < uVar15) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar15 * -0x10000;
                    uVar21 = uVar32;
                    if ((short)uVar32 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar15];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013931e;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013931e:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar15 <= uVar32) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 != 0) {
                    uVar25 = (uint)(uVar12 >> 0x16) & 0x40 | uVar25 & 0xaa |
                             (uint)(uVar12 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 |
                             flagsp[1] >> 0x17 & 4;
                    ppoVar22 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar13 = *ppoVar22;
                    uVar15 = poVar13->qeval;
                    uVar32 = uVar21 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar15 <= uVar32];
                      uVar21 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00139422;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00139422:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar15) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar21 = uVar32;
                      if ((short)uVar32 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_001394a0;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_001394a0:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar32) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    bVar5 = ""[uVar25];
                    uVar15 = uVar17;
                    if (OVar26 == bVar5) {
                      uVar15 = uVar8;
                    }
                    puVar19[uVar16 * 2] = uVar15;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
                    uVar12 = (ulong)((uint)uVar12 | (OVar26 ^ bVar5) << 0x19 | 0x400);
                    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
                  }
                }
                uVar15 = (uint)uVar12;
                if ((uVar12 & 0x40002000) == 0) {
                  uVar32 = (uint)(uVar12 >> 9);
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar32 & 0x1ef];
                  ppoVar22 = (t1->mqc).ctxs + bVar5;
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar25 = poVar13->qeval;
                  uVar33 = uVar21 - uVar25;
                  if (uVar20 >> 0x10 < uVar25) {
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar33];
                    uVar21 = uVar25;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_001395c2;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_001395c2:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar33 < uVar25) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar25 * -0x10000;
                    uVar21 = uVar33;
                    if ((short)uVar33 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar33 < uVar25];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_00139640;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_00139640:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar25 <= uVar33) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 == 0) goto switchD_00138d91_default;
                  uVar12 = (ulong)((uint)(uVar12 >> 0x19) & 0x40 | uVar32 & 0xaa |
                                   (uint)(uVar12 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 |
                                  flagsp[1] >> 0x1a & 4);
                  ppoVar22 = (t1->mqc).ctxs +
                             "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                             [uVar12];
                  poVar13 = *ppoVar22;
                  uVar25 = poVar13->qeval;
                  uVar32 = uVar21 - uVar25;
                  if (uVar25 <= uVar20 >> 0x10) {
                    uVar20 = uVar20 + uVar25 * -0x10000;
                    if ((short)uVar32 < 0) goto LAB_0013a227;
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar25];
                    uVar21 = uVar32;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_001397c8;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_001397c8:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    goto LAB_0013a230;
                  }
                  OVar18 = poVar13->mps;
                  *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar32];
                  uVar21 = uVar25;
                  do {
                    if (OVar24 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x200;
                          OVar24 = 7;
                          goto LAB_00139744;
                        }
                        uVar20 = uVar20 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        uVar20 = uVar20 + (uint)bVar5 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_00139744:
                    uVar21 = uVar21 * 2;
                    uVar20 = uVar20 * 2;
                    OVar24 = OVar24 - 1;
                  } while (uVar21 < 0x8000);
LAB_0013a195:
                  uVar33 = (uint)(OVar18 == 0);
                  if (uVar32 < uVar25) {
                    uVar33 = OVar18;
                  }
LAB_0013a240:
                  uVar32 = uVar33 ^ ""[uVar12];
                  uVar25 = uVar17;
                  if (uVar33 == ""[uVar12]) {
                    uVar25 = uVar8;
                  }
                  puVar19[uVar16 * 3] = uVar25;
                  *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
                  *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
                  uVar12 = (ulong)(t1->w + 2);
                  *(ulong *)(flagsp + (uVar12 - 1)) =
                       CONCAT44(uVar32 << 0x12,4) | 0x200000000 | *(ulong *)(flagsp + (uVar12 - 1));
                  *(byte *)(flagsp + uVar12 + 1) = (byte)flagsp[uVar12 + 1] | 1;
                  uVar15 = uVar32 << 0x1c | uVar15 | 0x2000;
                }
switchD_00138d91_default:
                *flagsp = uVar15 & 0xb6dfffff;
              }
              uVar11 = uVar11 + 1;
              puVar19 = puVar19 + 1;
              flagsp = flagsp + 1;
            } while (uVar11 != uVar16);
            uVar11 = t1->h;
          }
          local_60 = local_60 + 4;
          puVar19 = puVar19 + uVar16 * 3;
          flagsp = flagsp + 2;
        } while (local_60 < (uVar11 & 0xfffffffc));
      }
      (t1->mqc).curctx = ppoVar22;
      (t1->mqc).c = uVar20;
      (t1->mqc).a = uVar21;
      (t1->mqc).ct = OVar24;
      if ((uVar30 != 0) && (local_60 < uVar11)) {
        uVar20 = 0;
        do {
          if (t1->h != local_60) {
            uVar12 = 0;
            uVar30 = 0;
            do {
              opj_t1_dec_clnpass_step
                        (t1,flagsp,(OPJ_INT32 *)(puVar19 + uVar12),uVar8,(OPJ_UINT32)uVar30,0);
              uVar30 = uVar30 + 1;
              uVar12 = (ulong)((int)uVar12 + uVar16);
            } while (uVar30 < t1->h - local_60);
          }
          *flagsp = *flagsp & 0xb6dfffff;
          uVar20 = uVar20 + 1;
          flagsp = flagsp + 1;
          puVar19 = puVar19 + 1;
        } while (uVar20 != uVar16);
      }
    }
    else {
      if (uVar11 < 4) {
        local_60 = 0;
      }
      else {
        ppOVar1 = &(t1->mqc).bp;
        uVar17 = -uVar8;
        ppoVar4 = (t1->mqc).ctxs + 0x11;
        ppoVar31 = (t1->mqc).ctxs + 0x12;
        local_60 = 0;
        do {
          if (uVar30 != 0) {
            uVar11 = 0;
            do {
              uVar15 = *flagsp;
              uVar12 = (ulong)uVar15;
              if (uVar12 == 0) {
                poVar13 = *ppoVar4;
                uVar15 = poVar13->qeval;
                uVar25 = uVar21 - uVar15;
                if (uVar20 >> 0x10 < uVar15) {
                  OVar18 = poVar13->mps;
                  *ppoVar4 = (&poVar13->nmps)[uVar15 <= uVar25];
                  uVar21 = uVar15;
                  do {
                    if (OVar24 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013a559;
                        }
                        uVar20 = uVar20 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        uVar20 = uVar20 + (uint)bVar5 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013a559:
                    uVar21 = uVar21 * 2;
                    uVar20 = uVar20 * 2;
                    OVar24 = OVar24 - 1;
                  } while (uVar21 < 0x8000);
                  OVar26 = (uint)(OVar18 == 0);
                  if (uVar25 < uVar15) {
                    OVar26 = OVar18;
                  }
                }
                else {
                  uVar20 = uVar20 + uVar15 * -0x10000;
                  uVar21 = uVar25;
                  if ((short)uVar25 < 0) {
                    OVar26 = poVar13->mps;
                  }
                  else {
                    OVar18 = poVar13->mps;
                    *ppoVar4 = (&poVar13->nmps)[uVar25 < uVar15];
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013a5e3;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013a5e3:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar15 <= uVar25) {
                      OVar26 = OVar18;
                    }
                  }
                }
                ppoVar22 = ppoVar4;
                if (OVar26 != 0) {
                  poVar13 = *ppoVar31;
                  uVar15 = poVar13->qeval;
                  uVar21 = uVar21 - uVar15;
                  if (uVar20 >> 0x10 < uVar15) {
                    uVar32 = poVar13->mps;
                    poVar13 = (&poVar13->nmps)[uVar15 <= uVar21];
                    *ppoVar31 = poVar13;
                    uVar25 = uVar15;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013a74d;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013a74d:
                      uVar25 = uVar25 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar25 < 0x8000);
                    uVar33 = (uint)(uVar32 == 0);
                    if (uVar21 < uVar15) {
                      uVar33 = uVar32;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar15 * -0x10000;
                    uVar25 = uVar21;
                    if ((short)uVar21 < 0) {
                      uVar33 = poVar13->mps;
                    }
                    else {
                      uVar32 = poVar13->mps;
                      poVar13 = (&poVar13->nmps)[uVar21 < uVar15];
                      *ppoVar31 = poVar13;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013a7e3;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013a7e3:
                        uVar25 = uVar25 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar25 < 0x8000);
                      uVar33 = (uint)(uVar32 == 0);
                      if (uVar15 <= uVar21) {
                        uVar33 = uVar32;
                      }
                    }
                  }
                  uVar15 = poVar13->qeval;
                  uVar25 = uVar25 - uVar15;
                  if (uVar20 >> 0x10 < uVar15) {
                    uVar32 = poVar13->mps;
                    *ppoVar31 = (&poVar13->nmps)[uVar15 <= uVar25];
                    uVar21 = uVar15;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013aa27;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013aa27:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    uVar23 = (uint)(uVar32 == 0);
                    if (uVar25 < uVar15) {
                      uVar23 = uVar32;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar15 * -0x10000;
                    uVar21 = uVar25;
                    if ((short)uVar25 < 0) {
                      uVar23 = poVar13->mps;
                    }
                    else {
                      uVar32 = poVar13->mps;
                      *ppoVar31 = (&poVar13->nmps)[uVar25 < uVar15];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013aab5;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013aab5:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      uVar23 = (uint)(uVar32 == 0);
                      if (uVar15 <= uVar25) {
                        uVar23 = uVar32;
                      }
                    }
                  }
                  uVar12 = 0;
                  uVar15 = 0;
                  ppoVar22 = ppoVar31;
                  switch(uVar33 * 2 | uVar23) {
                  case 0:
                    uVar25 = flagsp[1] >> 0x11 & 4 | flagsp[-1] >> 0x13 & 1;
                    bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                            [uVar25];
                    poVar13 = (t1->mqc).ctxs[bVar5];
                    uVar15 = poVar13->qeval;
                    uVar21 = uVar21 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 <= uVar21];
                      uVar32 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013abb4;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013abb4:
                        uVar32 = uVar32 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar32 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar21 < uVar15) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar32 = uVar21;
                      if ((short)uVar21 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar21 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_0013b5e0;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_0013b5e0:
                          uVar32 = uVar32 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar32 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar21) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    bVar5 = ""[uVar25];
                    uVar21 = uVar17;
                    if (OVar26 == bVar5) {
                      uVar21 = uVar8;
                    }
                    *puVar19 = uVar21;
                    *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
                    bVar6 = (t1->mqc).lut_ctxno_zc_orient[2];
                    poVar13 = (t1->mqc).ctxs[bVar6];
                    uVar15 = poVar13->qeval;
                    uVar32 = uVar32 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      (t1->mqc).ctxs[bVar6] = (&poVar13->nmps)[uVar15 <= uVar32];
                      uVar21 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar6 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar6 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar6 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013b6ca;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar6 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013b6ca:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar29 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar15) {
                        OVar29 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar21 = uVar32;
                      if ((short)uVar32 < 0) {
                        OVar29 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        (t1->mqc).ctxs[bVar6] = (&poVar13->nmps)[uVar32 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar6 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar6 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar6 * 0x200;
                                OVar24 = 7;
                                goto LAB_0013b755;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar6 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_0013b755:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar29 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar32) {
                          OVar29 = OVar18;
                        }
                      }
                    }
                    uVar12 = (ulong)((OVar26 ^ bVar5) << 0x13 | 0x10);
                    if (OVar29 != 0) goto switchD_0013ab23_caseD_1;
                    break;
                  case 1:
switchD_0013ab23_caseD_1:
                    uVar25 = (uint)(uVar12 >> 0x13) & 0x40 | (uint)(uVar12 >> 3) & 0xaa |
                             (uint)(uVar12 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 |
                             flagsp[1] >> 0x14 & 4;
                    bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                            [uVar25];
                    poVar13 = (t1->mqc).ctxs[bVar5];
                    uVar15 = poVar13->qeval;
                    uVar32 = uVar21 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 <= uVar32];
                      uVar21 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013b86a;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013b86a:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar15) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar21 = uVar32;
                      if ((short)uVar32 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar32 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_0013b8f5;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_0013b8f5:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar32) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    bVar5 = ""[uVar25];
                    uVar15 = uVar17;
                    if (OVar26 == bVar5) {
                      uVar15 = uVar8;
                    }
                    puVar19[uVar30] = uVar15;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
                    uVar12 = (ulong)((uint)uVar12 | (OVar26 ^ bVar5) << 0x16 | 0x80);
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
                    break;
                  case 2:
                    goto switchD_0013ab23_caseD_2;
                  case 3:
                    goto switchD_0013ab23_caseD_3;
                  default:
                    goto switchD_0013ab23_default;
                  }
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar12 >> 6) & 0x1ef];
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar15 = poVar13->qeval;
                  uVar25 = uVar21 - uVar15;
                  if (uVar20 >> 0x10 < uVar15) {
                    OVar18 = poVar13->mps;
                    (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 <= uVar25];
                    uVar21 = uVar15;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013b9ff;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013b9ff:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar25 < uVar15) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar15 * -0x10000;
                    uVar21 = uVar25;
                    if ((short)uVar25 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar25 < uVar15];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013ba86;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013ba86:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar15 <= uVar25) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 != 0) {
switchD_0013ab23_caseD_2:
                    uVar25 = (uint)(uVar12 >> 0x16) & 0x40 | (uint)(uVar12 >> 6) & 0xaa |
                             (uint)(uVar12 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 |
                             flagsp[1] >> 0x17 & 4;
                    bVar5 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                            [uVar25];
                    poVar13 = (t1->mqc).ctxs[bVar5];
                    uVar15 = poVar13->qeval;
                    uVar32 = uVar21 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar15 <= uVar32];
                      uVar21 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013bb8e;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013bb8e:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar15) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar21 = uVar32;
                      if ((short)uVar32 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        (t1->mqc).ctxs[bVar5] = (&poVar13->nmps)[uVar32 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_0013bc19;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_0013bc19:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar32) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    bVar5 = ""[uVar25];
                    uVar15 = uVar17;
                    if (OVar26 == bVar5) {
                      uVar15 = uVar8;
                    }
                    puVar19[uVar16 * 2] = uVar15;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
                    uVar12 = (ulong)((uint)uVar12 | (OVar26 ^ bVar5) << 0x19 | 0x400);
                    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
                  }
                  uVar15 = (uint)uVar12;
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar12 >> 9) & 0x1ef];
                  ppoVar22 = (t1->mqc).ctxs + bVar5;
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar25 = poVar13->qeval;
                  uVar32 = uVar21 - uVar25;
                  if (uVar20 >> 0x10 < uVar25) {
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar32];
                    uVar21 = uVar25;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013bd2c;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013bd2c:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar32 < uVar25) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar25 * -0x10000;
                    uVar21 = uVar32;
                    if ((short)uVar32 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar25];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013bdb6;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013bdb6:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar25 <= uVar32) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 != 0) {
switchD_0013ab23_caseD_3:
                    uVar15 = (uint)uVar12;
                    uVar12 = (ulong)((uint)(uVar12 >> 0x19) & 0x40 | (uint)(uVar12 >> 9) & 0xaa |
                                     (uint)(uVar12 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 |
                                    flagsp[1] >> 0x1a & 4);
                    ppoVar22 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar12];
                    poVar13 = *ppoVar22;
                    uVar25 = poVar13->qeval;
                    uVar32 = uVar21 - uVar25;
                    if (uVar20 >> 0x10 < uVar25) {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar32];
                      uVar21 = uVar25;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013bec9;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013bec9:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar25) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar25 * -0x10000;
                      if ((short)uVar32 < 0) {
LAB_0013bf68:
                        uVar21 = uVar32;
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar25];
                        uVar21 = uVar32;
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_0013bf47;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_0013bf47:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
LAB_0013bf71:
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar25 <= uVar32) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    goto LAB_0013bf98;
                  }
                  goto switchD_0013ab23_default;
                }
              }
              else {
                if ((uVar15 & 0x200010) == 0) {
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar15 & 0x1ef];
                  ppoVar22 = (t1->mqc).ctxs + bVar5;
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar25 = poVar13->qeval;
                  uVar32 = uVar21 - uVar25;
                  if (uVar20 >> 0x10 < uVar25) {
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar32];
                    uVar21 = uVar25;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013a4ce;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013a4ce:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar32 < uVar25) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar25 * -0x10000;
                    uVar21 = uVar32;
                    if ((short)uVar32 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar25];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013a681;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013a681:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar25 <= uVar32) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 != 0) {
                    uVar32 = uVar15 >> 0x10 & 0x40 | uVar15 & 0xaa | uVar15 >> 0xe & 0x10 |
                             flagsp[-1] >> 0x13 & 1 | flagsp[1] >> 0x11 & 4;
                    ppoVar22 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar32];
                    poVar13 = *ppoVar22;
                    uVar25 = poVar13->qeval;
                    uVar33 = uVar21 - uVar25;
                    if (uVar20 >> 0x10 < uVar25) {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar33];
                      uVar21 = uVar25;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013a8e8;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013a8e8:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar33 < uVar25) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar25 * -0x10000;
                      uVar21 = uVar33;
                      if ((short)uVar33 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        *ppoVar22 = (&poVar13->nmps)[uVar33 < uVar25];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_0013a96d;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_0013a96d:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar25 <= uVar33) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    bVar5 = ""[uVar32];
                    uVar25 = uVar17;
                    if (OVar26 == bVar5) {
                      uVar25 = uVar8;
                    }
                    *puVar19 = uVar25;
                    *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
                    uVar12 = (ulong)((OVar26 ^ bVar5) << 0x13 | uVar15 | 0x10);
                  }
                }
                if ((uVar12 & 0x1000080) == 0) {
                  uVar25 = (uint)(uVar12 >> 3);
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
                  ppoVar22 = (t1->mqc).ctxs + bVar5;
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar15 = poVar13->qeval;
                  uVar32 = uVar21 - uVar15;
                  if (uVar20 >> 0x10 < uVar15) {
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar15 <= uVar32];
                    uVar21 = uVar15;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013acc2;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013acc2:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar32 < uVar15) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar15 * -0x10000;
                    uVar21 = uVar32;
                    if ((short)uVar32 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar15];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013ad47;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013ad47:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar15 <= uVar32) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 != 0) {
                    uVar25 = (uint)(uVar12 >> 0x13) & 0x40 | uVar25 & 0xaa |
                             (uint)(uVar12 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 |
                             flagsp[1] >> 0x14 & 4;
                    ppoVar22 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar13 = *ppoVar22;
                    uVar15 = poVar13->qeval;
                    uVar32 = uVar21 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar15 <= uVar32];
                      uVar21 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013ae4e;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013ae4e:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar15) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar21 = uVar32;
                      if ((short)uVar32 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_0013aed2;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_0013aed2:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar32) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    bVar5 = ""[uVar25];
                    uVar15 = uVar17;
                    if (OVar26 == bVar5) {
                      uVar15 = uVar8;
                    }
                    puVar19[uVar30] = uVar15;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
                    uVar12 = (ulong)((uint)uVar12 | (OVar26 ^ bVar5) << 0x16 | 0x80);
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
                  }
                }
                if ((uVar12 & 0x8000400) == 0) {
                  uVar25 = (uint)(uVar12 >> 6);
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
                  ppoVar22 = (t1->mqc).ctxs + bVar5;
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar15 = poVar13->qeval;
                  uVar32 = uVar21 - uVar15;
                  if (uVar20 >> 0x10 < uVar15) {
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar15 <= uVar32];
                    uVar21 = uVar15;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013aff9;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013aff9:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar32 < uVar15) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar15 * -0x10000;
                    uVar21 = uVar32;
                    if ((short)uVar32 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar15];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013b07e;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013b07e:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar15 <= uVar32) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 != 0) {
                    uVar25 = (uint)(uVar12 >> 0x16) & 0x40 | uVar25 & 0xaa |
                             (uint)(uVar12 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 |
                             flagsp[1] >> 0x17 & 4;
                    ppoVar22 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar13 = *ppoVar22;
                    uVar15 = poVar13->qeval;
                    uVar32 = uVar21 - uVar15;
                    if (uVar20 >> 0x10 < uVar15) {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar15 <= uVar32];
                      uVar21 = uVar15;
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013b185;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013b185:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar32 < uVar15) {
                        OVar26 = OVar18;
                      }
                    }
                    else {
                      uVar20 = uVar20 + uVar15 * -0x10000;
                      uVar21 = uVar32;
                      if ((short)uVar32 < 0) {
                        OVar26 = poVar13->mps;
                      }
                      else {
                        OVar18 = poVar13->mps;
                        *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar15];
                        do {
                          if (OVar24 == 0) {
                            pOVar7 = *ppOVar1;
                            bVar5 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar5 < 0x90) {
                                *ppOVar1 = pOVar7 + 1;
                                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                                OVar24 = 7;
                                goto LAB_0013b209;
                              }
                              uVar20 = uVar20 + 0xff00;
                              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar2 = *pOVar2 + 1;
                            }
                            else {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x100;
                            }
                            OVar24 = 8;
                          }
LAB_0013b209:
                          uVar21 = uVar21 * 2;
                          uVar20 = uVar20 * 2;
                          OVar24 = OVar24 - 1;
                        } while (uVar21 < 0x8000);
                        OVar26 = (uint)(OVar18 == 0);
                        if (uVar15 <= uVar32) {
                          OVar26 = OVar18;
                        }
                      }
                    }
                    bVar5 = ""[uVar25];
                    uVar15 = uVar17;
                    if (OVar26 == bVar5) {
                      uVar15 = uVar8;
                    }
                    puVar19[uVar16 * 2] = uVar15;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
                    uVar12 = (ulong)((uint)uVar12 | (OVar26 ^ bVar5) << 0x19 | 0x400);
                    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
                  }
                }
                uVar15 = (uint)uVar12;
                if ((uVar12 & 0x40002000) == 0) {
                  uVar32 = (uint)(uVar12 >> 9);
                  bVar5 = (t1->mqc).lut_ctxno_zc_orient[uVar32 & 0x1ef];
                  ppoVar22 = (t1->mqc).ctxs + bVar5;
                  poVar13 = (t1->mqc).ctxs[bVar5];
                  uVar25 = poVar13->qeval;
                  uVar33 = uVar21 - uVar25;
                  if (uVar20 >> 0x10 < uVar25) {
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar33];
                    uVar21 = uVar25;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013b330;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013b330:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    OVar26 = (uint)(OVar18 == 0);
                    if (uVar33 < uVar25) {
                      OVar26 = OVar18;
                    }
                  }
                  else {
                    uVar20 = uVar20 + uVar25 * -0x10000;
                    uVar21 = uVar33;
                    if ((short)uVar33 < 0) {
                      OVar26 = poVar13->mps;
                    }
                    else {
                      OVar18 = poVar13->mps;
                      *ppoVar22 = (&poVar13->nmps)[uVar33 < uVar25];
                      do {
                        if (OVar24 == 0) {
                          pOVar7 = *ppOVar1;
                          bVar5 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar5 < 0x90) {
                              *ppOVar1 = pOVar7 + 1;
                              uVar20 = uVar20 + (uint)bVar5 * 0x200;
                              OVar24 = 7;
                              goto LAB_0013b3b5;
                            }
                            uVar20 = uVar20 + 0xff00;
                            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar2 = *pOVar2 + 1;
                          }
                          else {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x100;
                          }
                          OVar24 = 8;
                        }
LAB_0013b3b5:
                        uVar21 = uVar21 * 2;
                        uVar20 = uVar20 * 2;
                        OVar24 = OVar24 - 1;
                      } while (uVar21 < 0x8000);
                      OVar26 = (uint)(OVar18 == 0);
                      if (uVar25 <= uVar33) {
                        OVar26 = OVar18;
                      }
                    }
                  }
                  if (OVar26 == 0) goto switchD_0013ab23_default;
                  uVar12 = (ulong)((uint)(uVar12 >> 0x19) & 0x40 | uVar32 & 0xaa |
                                   (uint)(uVar12 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 |
                                  flagsp[1] >> 0x1a & 4);
                  ppoVar22 = (t1->mqc).ctxs +
                             "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                             [uVar12];
                  poVar13 = *ppoVar22;
                  uVar25 = poVar13->qeval;
                  uVar32 = uVar21 - uVar25;
                  if (uVar25 <= uVar20 >> 0x10) {
                    uVar20 = uVar20 + uVar25 * -0x10000;
                    if ((short)uVar32 < 0) goto LAB_0013bf68;
                    OVar18 = poVar13->mps;
                    *ppoVar22 = (&poVar13->nmps)[uVar32 < uVar25];
                    uVar21 = uVar32;
                    do {
                      if (OVar24 == 0) {
                        pOVar7 = *ppOVar1;
                        bVar5 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar5 < 0x90) {
                            *ppOVar1 = pOVar7 + 1;
                            uVar20 = uVar20 + (uint)bVar5 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013b53e;
                          }
                          uVar20 = uVar20 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013b53e:
                      uVar21 = uVar21 * 2;
                      uVar20 = uVar20 * 2;
                      OVar24 = OVar24 - 1;
                    } while (uVar21 < 0x8000);
                    goto LAB_0013bf71;
                  }
                  OVar18 = poVar13->mps;
                  *ppoVar22 = (&poVar13->nmps)[uVar25 <= uVar32];
                  uVar21 = uVar25;
                  do {
                    if (OVar24 == 0) {
                      pOVar7 = *ppOVar1;
                      bVar5 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar5 < 0x90) {
                          *ppOVar1 = pOVar7 + 1;
                          uVar20 = uVar20 + (uint)bVar5 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013b4bc;
                        }
                        uVar20 = uVar20 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar7 + 1;
                        uVar20 = uVar20 + (uint)bVar5 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013b4bc:
                    uVar21 = uVar21 * 2;
                    uVar20 = uVar20 * 2;
                    OVar24 = OVar24 - 1;
                  } while (uVar21 < 0x8000);
                  OVar26 = (uint)(OVar18 == 0);
                  if (uVar32 < uVar25) {
                    OVar26 = OVar18;
                  }
LAB_0013bf98:
                  uVar32 = OVar26 ^ ""[uVar12];
                  uVar25 = uVar17;
                  if (OVar26 == ""[uVar12]) {
                    uVar25 = uVar8;
                  }
                  puVar19[uVar16 * 3] = uVar25;
                  *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
                  *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
                  uVar12 = (ulong)(t1->w + 2);
                  *(ulong *)(flagsp + (uVar12 - 1)) =
                       CONCAT44(uVar32 << 0x12,4) | 0x200000000 | *(ulong *)(flagsp + (uVar12 - 1));
                  *(byte *)(flagsp + uVar12 + 1) = (byte)flagsp[uVar12 + 1] | 1;
                  uVar15 = uVar32 << 0x1c | uVar15 | 0x2000;
                }
switchD_0013ab23_default:
                *flagsp = uVar15 & 0xb6dfffff;
              }
              uVar11 = uVar11 + 1;
              puVar19 = puVar19 + 1;
              flagsp = flagsp + 1;
            } while (uVar11 != uVar16);
            uVar11 = t1->h;
          }
          local_60 = local_60 + 4;
          puVar19 = puVar19 + uVar16 * 3;
          flagsp = flagsp + 2;
        } while (local_60 < (uVar11 & 0xfffffffc));
      }
      (t1->mqc).curctx = ppoVar22;
      (t1->mqc).c = uVar20;
      (t1->mqc).a = uVar21;
      (t1->mqc).ct = OVar24;
      if ((uVar30 != 0) && (local_60 < uVar11)) {
        uVar20 = 0;
        do {
          if (t1->h != local_60) {
            uVar12 = 0;
            uVar30 = 0;
            do {
              opj_t1_dec_clnpass_step
                        (t1,flagsp,(OPJ_INT32 *)(puVar19 + uVar12),uVar8,(OPJ_UINT32)uVar30,1);
              uVar30 = uVar30 + 1;
              uVar12 = (ulong)((int)uVar12 + uVar16);
            } while (uVar30 < t1->h - local_60);
          }
          *flagsp = *flagsp & 0xb6dfffff;
          uVar20 = uVar20 + 1;
          flagsp = flagsp + 1;
          puVar19 = puVar19 + 1;
        } while (uVar20 != uVar16);
      }
    }
  }
  if ((cblksty & 0x20U) != 0) {
    (t1->mqc).curctx = (t1->mqc).ctxs + 0x12;
    poVar13 = (t1->mqc).ctxs[0x12];
    uVar16 = poVar13->qeval;
    uVar20 = (t1->mqc).c;
    uVar21 = (t1->mqc).a - uVar16;
    (t1->mqc).a = uVar21;
    if (uVar20 >> 0x10 < uVar16) {
      (t1->mqc).a = uVar16;
      poVar13 = (&poVar13->nmps)[uVar16 <= uVar21];
      (t1->mqc).ctxs[0x12] = poVar13;
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar7 = (t1->mqc).bp;
          bVar5 = pOVar7[1];
          if (*pOVar7 == 0xff) {
            if (bVar5 < 0x90) {
              (t1->mqc).bp = pOVar7 + 1;
              uVar20 = uVar20 + (uint)bVar5 * 0x200;
              OVar24 = 7;
              goto LAB_0013de74;
            }
            uVar20 = uVar20 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar7 + 1;
            uVar20 = uVar20 + (uint)bVar5 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013de74:
        uVar16 = uVar16 * 2;
        (t1->mqc).a = uVar16;
        uVar20 = uVar20 * 2;
        (t1->mqc).c = uVar20;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
        uVar21 = uVar16;
      } while (uVar16 < 0x8000);
    }
    else {
      uVar20 = uVar20 + uVar16 * -0x10000;
      (t1->mqc).c = uVar20;
      if (-1 < (short)uVar21) {
        poVar13 = (&poVar13->nmps)[uVar21 < uVar16];
        (t1->mqc).ctxs[0x12] = poVar13;
        OVar24 = (t1->mqc).ct;
        do {
          if (OVar24 == 0) {
            pOVar7 = (t1->mqc).bp;
            bVar5 = pOVar7[1];
            if (*pOVar7 == 0xff) {
              if (bVar5 < 0x90) {
                (t1->mqc).bp = pOVar7 + 1;
                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                OVar24 = 7;
                goto LAB_0013deff;
              }
              uVar20 = uVar20 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar7 + 1;
              uVar20 = uVar20 + (uint)bVar5 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013deff:
          uVar21 = uVar21 * 2;
          (t1->mqc).a = uVar21;
          uVar20 = uVar20 * 2;
          (t1->mqc).c = uVar20;
          OVar24 = OVar24 - 1;
          (t1->mqc).ct = OVar24;
        } while (uVar21 < 0x8000);
      }
    }
    uVar16 = poVar13->qeval;
    uVar21 = uVar21 - uVar16;
    (t1->mqc).a = uVar21;
    if (uVar20 >> 0x10 < uVar16) {
      (t1->mqc).a = uVar16;
      poVar13 = (&poVar13->nmps)[uVar16 <= uVar21];
      (t1->mqc).ctxs[0x12] = poVar13;
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar7 = (t1->mqc).bp;
          bVar5 = pOVar7[1];
          if (*pOVar7 == 0xff) {
            if (bVar5 < 0x90) {
              (t1->mqc).bp = pOVar7 + 1;
              uVar20 = uVar20 + (uint)bVar5 * 0x200;
              OVar24 = 7;
              goto LAB_0013df8e;
            }
            uVar20 = uVar20 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar7 + 1;
            uVar20 = uVar20 + (uint)bVar5 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013df8e:
        uVar16 = uVar16 * 2;
        (t1->mqc).a = uVar16;
        uVar20 = uVar20 * 2;
        (t1->mqc).c = uVar20;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
        uVar21 = uVar16;
      } while (uVar16 < 0x8000);
    }
    else {
      uVar20 = uVar20 + uVar16 * -0x10000;
      (t1->mqc).c = uVar20;
      if (-1 < (short)uVar21) {
        poVar13 = (&poVar13->nmps)[uVar21 < uVar16];
        (t1->mqc).ctxs[0x12] = poVar13;
        OVar24 = (t1->mqc).ct;
        do {
          if (OVar24 == 0) {
            pOVar7 = (t1->mqc).bp;
            bVar5 = pOVar7[1];
            if (*pOVar7 == 0xff) {
              if (bVar5 < 0x90) {
                (t1->mqc).bp = pOVar7 + 1;
                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                OVar24 = 7;
                goto LAB_0013e019;
              }
              uVar20 = uVar20 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar7 + 1;
              uVar20 = uVar20 + (uint)bVar5 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013e019:
          uVar21 = uVar21 * 2;
          (t1->mqc).a = uVar21;
          uVar20 = uVar20 * 2;
          (t1->mqc).c = uVar20;
          OVar24 = OVar24 - 1;
          (t1->mqc).ct = OVar24;
        } while (uVar21 < 0x8000);
      }
    }
    uVar16 = poVar13->qeval;
    uVar21 = uVar21 - uVar16;
    (t1->mqc).a = uVar21;
    if (uVar20 >> 0x10 < uVar16) {
      (t1->mqc).a = uVar16;
      poVar13 = (&poVar13->nmps)[uVar16 <= uVar21];
      (t1->mqc).ctxs[0x12] = poVar13;
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar7 = (t1->mqc).bp;
          bVar5 = pOVar7[1];
          if (*pOVar7 == 0xff) {
            if (bVar5 < 0x90) {
              (t1->mqc).bp = pOVar7 + 1;
              uVar20 = uVar20 + (uint)bVar5 * 0x200;
              OVar24 = 7;
              goto LAB_0013e0a8;
            }
            uVar20 = uVar20 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar7 + 1;
            uVar20 = uVar20 + (uint)bVar5 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013e0a8:
        uVar16 = uVar16 * 2;
        (t1->mqc).a = uVar16;
        uVar20 = uVar20 * 2;
        (t1->mqc).c = uVar20;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
        uVar21 = uVar16;
      } while (uVar16 < 0x8000);
    }
    else {
      uVar20 = uVar20 + uVar16 * -0x10000;
      (t1->mqc).c = uVar20;
      if (-1 < (short)uVar21) {
        poVar13 = (&poVar13->nmps)[uVar21 < uVar16];
        (t1->mqc).ctxs[0x12] = poVar13;
        OVar24 = (t1->mqc).ct;
        do {
          if (OVar24 == 0) {
            pOVar7 = (t1->mqc).bp;
            bVar5 = pOVar7[1];
            if (*pOVar7 == 0xff) {
              if (bVar5 < 0x90) {
                (t1->mqc).bp = pOVar7 + 1;
                uVar20 = uVar20 + (uint)bVar5 * 0x200;
                OVar24 = 7;
                goto LAB_0013e133;
              }
              uVar20 = uVar20 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar7 + 1;
              uVar20 = uVar20 + (uint)bVar5 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013e133:
          uVar21 = uVar21 * 2;
          (t1->mqc).a = uVar21;
          uVar20 = uVar20 * 2;
          (t1->mqc).c = uVar20;
          OVar24 = OVar24 - 1;
          (t1->mqc).ct = OVar24;
        } while (uVar21 < 0x8000);
      }
    }
    uVar16 = poVar13->qeval;
    uVar21 = uVar21 - uVar16;
    (t1->mqc).a = uVar21;
    if (uVar20 >> 0x10 < uVar16) {
      (t1->mqc).a = uVar16;
      (t1->mqc).ctxs[0x12] = (&poVar13->nmps)[uVar16 <= uVar21];
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar7 = (t1->mqc).bp;
          bVar5 = pOVar7[1];
          if (*pOVar7 == 0xff) {
            if (bVar5 < 0x90) {
              (t1->mqc).bp = pOVar7 + 1;
              uVar20 = uVar20 + (uint)bVar5 * 0x200;
              OVar24 = 7;
              goto LAB_0013e1c0;
            }
            uVar20 = uVar20 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar7 + 1;
            uVar20 = uVar20 + (uint)bVar5 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013e1c0:
        uVar16 = uVar16 * 2;
        (t1->mqc).a = uVar16;
        uVar20 = uVar20 * 2;
        (t1->mqc).c = uVar20;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
      } while (uVar16 < 0x8000);
    }
    else {
      OVar24 = uVar20 + uVar16 * -0x10000;
      (t1->mqc).c = OVar24;
      if (-1 < (short)uVar21) {
        (t1->mqc).ctxs[0x12] = (&poVar13->nmps)[uVar21 < uVar16];
        OVar18 = (t1->mqc).ct;
        do {
          if (OVar18 == 0) {
            pOVar7 = (t1->mqc).bp;
            bVar5 = pOVar7[1];
            if (*pOVar7 == 0xff) {
              if (bVar5 < 0x90) {
                (t1->mqc).bp = pOVar7 + 1;
                OVar24 = OVar24 + (uint)bVar5 * 0x200;
                OVar18 = 7;
                goto LAB_0013e24c;
              }
              OVar24 = OVar24 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar7 + 1;
              OVar24 = OVar24 + (uint)bVar5 * 0x100;
            }
            OVar18 = 8;
          }
LAB_0013e24c:
          uVar21 = uVar21 * 2;
          (t1->mqc).a = uVar21;
          OVar24 = OVar24 * 2;
          (t1->mqc).c = OVar24;
          OVar18 = OVar18 - 1;
          (t1->mqc).ct = OVar18;
        } while (uVar21 < 0x8000);
      }
    }
  }
  return;
}

Assistant:

static void opj_t1_dec_clnpass(
    opj_t1_t *t1,
    OPJ_INT32 bpno,
    OPJ_INT32 cblksty)
{
    if (t1->w == 64 && t1->h == 64) {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_clnpass_64x64_vsc(t1, bpno);
        } else {
            opj_t1_dec_clnpass_64x64_novsc(t1, bpno);
        }
    } else {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_clnpass_generic_vsc(t1, bpno);
        } else {
            opj_t1_dec_clnpass_generic_novsc(t1, bpno);
        }
    }
    opj_t1_dec_clnpass_check_segsym(t1, cblksty);
}